

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupFlip(Gia_Man_t *p,int *pInitState)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar14 = 1;
    lVar13 = 0x14;
    do {
      pGVar2 = p->pObjs;
      uVar3 = *(ulong *)((long)pGVar2 + lVar13 + -8);
      uVar11 = (uint)uVar3;
      iVar6 = (int)(uVar3 & 0x1fffffff);
      uVar7 = (uint)(uVar3 >> 0x20);
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar11 < 0) {
        if ((uVar11 & 0x9fffffff) == 0x9fffffff) {
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar3 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001d94b9:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001d94b9;
          uVar7 = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
          *(uint *)(&pGVar2->field_0x0 + lVar13) = uVar7;
          uVar5 = *(undefined8 *)((long)pGVar2 + lVar13 + -8);
          if (-1 < (int)uVar5) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar11 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
          iVar6 = p->vCis->nSize - p->nRegs;
          uVar12 = uVar11 - iVar6;
          if (iVar6 <= (int)uVar11) {
            if ((int)uVar7 < 0) goto LAB_001d949a;
            *(uint *)(&pGVar2->field_0x0 + lVar13) =
                 ((uint)pInitState[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0 | uVar7;
          }
        }
        else if ((int)uVar11 < 0 && iVar6 != 0x1fffffff) {
          uVar11 = *(uint *)((long)pGVar2 + lVar13 + (ulong)(uint)(iVar6 << 2) * -3);
          if ((int)uVar11 < 0) goto LAB_001d949a;
          uVar11 = uVar11 ^ (uint)(uVar3 >> 0x1d) & 1;
          *(uint *)(&pGVar2->field_0x0 + lVar13) = uVar11;
          uVar7 = uVar7 & 0x1fffffff;
          iVar6 = p->vCos->nSize - p->nRegs;
          uVar12 = uVar7 - iVar6;
          if (iVar6 <= (int)uVar7) {
            uVar11 = uVar11 ^ ((uint)pInitState[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0;
            *(uint *)(&pGVar2->field_0x0 + lVar13) = uVar11;
          }
          iVar6 = Gia_ManAppendCo(p_00,uVar11);
          goto LAB_001d9464;
        }
      }
      else {
        uVar11 = *(uint *)((long)pGVar2 + lVar13 + (ulong)(uint)(iVar6 << 2) * -3);
        if (((int)uVar11 < 0) ||
           (uVar12 = *(uint *)((long)pGVar2 +
                              lVar13 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar12 < 0)) {
LAB_001d949a:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar6 = Gia_ManAppendAnd(p_00,uVar11 ^ (uint)(uVar3 >> 0x1d) & 1,uVar12 ^ uVar7 >> 0x1d & 1)
        ;
LAB_001d9464:
        *(int *)(&pGVar2->field_0x0 + lVar13) = iVar6;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlip( Gia_Man_t * p, int * pInitState )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( Gia_ObjCioId(pObj) >= Gia_ManPiNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPiNum(p)) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            if ( Gia_ObjCioId(pObj) >= Gia_ManPoNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPoNum(p)) );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}